

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_atomax.c
# Opt level: O2

int main(void)

{
  long lVar1;
  
  lVar1 = _PDCLIB_atomax("123");
  if (lVar1 != 0x7b) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_atomax.c, line %d - %s\n"
           ,0x34,"_PDCLIB_atomax( \"123\" ) == 123");
  }
  lVar1 = _PDCLIB_atomax(" \n\v\t\f123xyz");
  if (lVar1 != 0x7b) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_atomax.c, line %d - %s\n"
           ,0x36,"_PDCLIB_atomax( \" \\n\\v\\t\\f123xyz\" ) == 123");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* basic functionality */
    TESTCASE( _PDCLIB_atomax( "123" ) == 123 );
    /* testing skipping of leading whitespace and trailing garbage */
    TESTCASE( _PDCLIB_atomax( " \n\v\t\f123xyz" ) == 123 );
#endif
    return TEST_RESULTS;
}